

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::PushItemFlag(ImGuiItemFlags option,bool enabled)

{
  int *piVar1;
  uint uVar2;
  int *piVar3;
  ImGuiContext *pIVar4;
  int iVar5;
  int *piVar6;
  int iVar7;
  uint uVar8;
  undefined7 in_register_00000031;
  int iVar9;
  ImGuiContext *ctx;
  
  pIVar4 = GImGui;
  uVar2 = (GImGui->CurrentWindow->DC).ItemFlags;
  uVar8 = uVar2 | option;
  if ((int)CONCAT71(in_register_00000031,enabled) == 0) {
    uVar8 = ~option & uVar2;
  }
  (GImGui->CurrentWindow->DC).ItemFlags = uVar8;
  iVar5 = (pIVar4->ItemFlagsStack).Size;
  if (iVar5 == (pIVar4->ItemFlagsStack).Capacity) {
    if (iVar5 == 0) {
      iVar7 = 8;
    }
    else {
      iVar7 = iVar5 / 2 + iVar5;
    }
    iVar9 = iVar5 + 1;
    if (iVar5 + 1 < iVar7) {
      iVar9 = iVar7;
    }
    piVar6 = &(pIVar4->IO).MetricsActiveAllocations;
    *piVar6 = *piVar6 + 1;
    piVar6 = (int *)(*GImAllocatorAllocFunc)((long)iVar9 << 2,GImAllocatorUserData);
    piVar3 = (pIVar4->ItemFlagsStack).Data;
    if (piVar3 != (int *)0x0) {
      memcpy(piVar6,piVar3,(long)(pIVar4->ItemFlagsStack).Size << 2);
      piVar3 = (pIVar4->ItemFlagsStack).Data;
      if ((piVar3 != (int *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + -1;
      }
      (*GImAllocatorFreeFunc)(piVar3,GImAllocatorUserData);
    }
    (pIVar4->ItemFlagsStack).Data = piVar6;
    (pIVar4->ItemFlagsStack).Capacity = iVar9;
    iVar5 = (pIVar4->ItemFlagsStack).Size;
  }
  else {
    piVar6 = (pIVar4->ItemFlagsStack).Data;
  }
  piVar6[iVar5] = uVar8;
  (pIVar4->ItemFlagsStack).Size = (pIVar4->ItemFlagsStack).Size + 1;
  return;
}

Assistant:

void ImGui::PushItemFlag(ImGuiItemFlags option, bool enabled)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    ImGuiItemFlags item_flags = window->DC.ItemFlags;
    IM_ASSERT(item_flags == g.ItemFlagsStack.back());
    if (enabled)
        item_flags |= option;
    else
        item_flags &= ~option;
    window->DC.ItemFlags = item_flags;
    g.ItemFlagsStack.push_back(item_flags);
}